

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<float>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *__src;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  string result_str;
  string reference_str;
  float array_data [16];
  float reference [8];
  float result [8];
  stringstream ss;
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  float local_268 [4];
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  long *local_220;
  long local_210 [2];
  AttributeFormatTest *local_200;
  float local_1f8 [8];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  ios_base local_140 [8];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x1680))(this->m_po);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  local_200 = this;
  (**(code **)(lVar5 + 0xd8))(this->m_vao);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar5 + 0x30))(0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar5 + 0x538))(0,0,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar5 + 0x638))();
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  __src = (void *)(**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uVar1 = size * 2;
  uVar13 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    memcpy(&local_1d8,__src,uVar13 * 4);
  }
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar16 = 0x3fb00000;
  }
  else {
    uVar16 = 0x3ff00000;
  }
  local_268[0] = 0.0;
  local_268[1] = (float)(double)((ulong)uVar16 << 0x20);
  local_268[2] = (float)((double)((ulong)uVar16 << 0x20) + (double)((ulong)uVar16 << 0x20));
  local_268[3] = (float)((double)((ulong)uVar16 << 0x20) * 3.0);
  local_258 = (float)((double)((ulong)uVar16 << 0x20) * 4.0);
  local_254 = (float)((double)((ulong)uVar16 << 0x20) * 5.0);
  local_250 = (float)((double)((ulong)uVar16 << 0x20) * 6.0);
  local_24c = (float)((double)((ulong)uVar16 << 0x20) * 7.0);
  local_248 = (float)((double)((ulong)uVar16 << 0x20) * 8.0);
  local_244 = (float)((double)((ulong)uVar16 << 0x20) * 9.0);
  local_240 = (float)((double)((ulong)uVar16 << 0x20) * 10.0);
  local_23c = (float)((double)((ulong)uVar16 << 0x20) * 11.0);
  local_238 = (float)((double)((ulong)uVar16 << 0x20) * 12.0);
  local_234 = (float)((double)((ulong)uVar16 << 0x20) * 13.0);
  local_230 = (float)((double)((ulong)uVar16 << 0x20) * 14.0);
  local_22c = (float)((double)((ulong)uVar16 << 0x20) * 15.0);
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[3] = 0.0;
  iVar8 = 0;
  iVar9 = 0;
  iVar3 = 0;
  do {
    uVar10 = (ulong)(uint)size;
    iVar11 = iVar8;
    iVar12 = iVar9;
    if (0 < size) {
      do {
        local_1f8[iVar12] = local_268[iVar11] + local_268[size + iVar11];
        iVar12 = iVar12 + 1;
        iVar11 = iVar11 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    iVar9 = iVar9 + size;
    iVar8 = iVar8 + uVar1;
    bVar14 = iVar3 == 0;
    iVar3 = iVar3 + 1;
  } while (bVar14);
  bVar14 = (int)uVar1 < 1;
  if (0 < (int)uVar1) {
    fVar15 = local_1f8[0] - (float)local_1d8;
    fVar17 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar17 = fVar15;
    }
    if (fVar17 < 0.03125) {
      uVar10 = 1;
      do {
        uVar6 = uVar10;
        if (uVar13 == uVar6) {
          return uVar13 <= uVar6;
        }
        fVar15 = local_1f8[uVar6] - *(float *)((long)&local_1d8 + uVar6 * 4);
        fVar17 = -fVar15;
        if (-fVar15 <= fVar15) {
          fVar17 = fVar15;
        }
        uVar10 = uVar6 + 1;
      } while (fVar17 < 0.03125);
      bVar14 = uVar13 <= uVar6;
    }
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"[ ","");
    uVar10 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>((double)local_1f8[uVar10]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_288,(ulong)local_2a8[0]);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0],local_298[0] + 1);
      }
      std::__cxx11::string::append((char *)local_288);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    local_2a8[0] = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"[ ","");
    uVar13 = 1;
    if (1 < (int)uVar1) {
      uVar13 = (ulong)uVar1;
    }
    uVar10 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>((double)*(float *)((long)&local_1d8 + uVar10 * 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_2a8,(ulong)local_220);
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      std::__cxx11::string::append((char *)local_2a8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    local_1b8 = (undefined1  [8])((local_200->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Result vector is equal to ",0x1a);
    plVar2 = local_2a8[0];
    iVar3 = (int)(ostringstream *)&local_1b0;
    if (local_2a8[0] == (long *)0x0) {
      std::ios::clear(iVar3 + (int)local_1b0[-3]);
    }
    else {
      sVar7 = strlen((char *)local_2a8[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar2,sVar7)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", but ",6);
    plVar2 = local_288[0];
    if (local_288[0] == (long *)0x0) {
      std::ios::clear(iVar3 + (int)local_1b0[-3]);
    }
    else {
      sVar7 = strlen((char *)local_288[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar2,sVar7)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],local_298[0] + 1);
    }
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
  }
  return bVar14;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}